

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_unsigned_long_&> *
testing::internal::
MatcherCastImpl<const_unsigned_long_&,_testing::internal::LtMatcher<unsigned_long>_>::
CastImpl<false>(Matcher<unsigned_long_const&> *__return_storage_ptr__,
               LtMatcher<unsigned_long> *polymorphic_matcher_or_value)

{
  LtMatcher<unsigned_long> *polymorphic_matcher_or_value_local;
  
  Matcher<unsigned_long_const&>::Matcher<testing::internal::LtMatcher<unsigned_long>const&,void>
            (__return_storage_ptr__,polymorphic_matcher_or_value);
  return (Matcher<const_unsigned_long_&> *)__return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& polymorphic_matcher_or_value,
                             std::true_type /* convertible_to_matcher */,
                             std::integral_constant<bool, Ignore>) {
    // M is implicitly convertible to Matcher<T>, which means that either
    // M is a polymorphic matcher or Matcher<T> has an implicit constructor
    // from M.  In both cases using the implicit conversion will produce a
    // matcher.
    //
    // Even if T has an implicit constructor from M, it won't be called because
    // creating Matcher<T> would require a chain of two user-defined conversions
    // (first to create T from M and then to create Matcher<T> from T).
    return polymorphic_matcher_or_value;
  }